

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void town_gen_layout(chunk_conflict *c,player *p)

{
  ushort uVar1;
  bool bVar2;
  loc lot;
  loc lot_00;
  loc xroads_00;
  loc xroads_01;
  loc xroads_02;
  loc xroads_03;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  bool bVar3;
  _Bool _Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int B;
  int B_00;
  square_conflict *psVar8;
  loc lVar9;
  loc_conflict lVar10;
  wchar_t local_e0;
  wchar_t local_dc;
  wchar_t local_d8;
  _Bool local_89;
  int iStack_88;
  int iStack_84;
  _Bool found_spot;
  loc store_lot;
  wchar_t lot_max_y;
  wchar_t lot_min_y;
  wchar_t lot_max_x;
  wchar_t lot_min_x;
  wchar_t local_5c;
  uint16_t lot_wid;
  uint16_t lot_hgt;
  wchar_t max_store_x;
  wchar_t min_store_x;
  wchar_t max_store_y;
  _Bool success;
  wchar_t num_attempts;
  wchar_t max_attempts;
  wchar_t ruins_percent;
  wchar_t num_lava;
  loc xroads;
  loc pgrid;
  loc grid;
  wchar_t y;
  wchar_t x;
  wchar_t n;
  player *p_local;
  chunk_conflict *c_local;
  
  uVar5 = Rand_div(3);
  bVar3 = false;
  max_store_x = L'\0';
  _lot_wid = (wchar_t)z_info->town_wid;
  local_5c = L'\0';
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',true
                );
  do {
    do {
      if (bVar3) {
        lVar10 = (loc_conflict)loc(xroads.x,xroads.y + 1);
        square_set_feat((chunk *)c,lVar10,L'\x01');
        fill_rectangle(c,xroads.y + L'\x02',xroads.x + L'\xffffffff',max_store_x,xroads.x + L'\x01',
                       L'\x01',L'\0');
        fill_rectangle(c,num_lava,_lot_wid,num_lava + L'\x01',local_5c,L'\x01',L'\0');
        lVar10.y = xroads.y;
        lVar10.x = xroads.x;
        square_set_feat((chunk *)c,lVar10,L'\x06');
        lVar9.y = xroads.y;
        lVar9.x = xroads.x;
        player_place((chunk_conflict1 *)c,p,lVar9);
        return;
      }
      for (pgrid.y = 1; pgrid.y < c->height + -1; pgrid.y = pgrid.y + 1) {
        for (pgrid.x = 1; pgrid.x < c->width + -1; pgrid.x = pgrid.x + 1) {
          grid_01.y = pgrid.y;
          grid_01.x = pgrid.x;
          square_set_feat((chunk *)c,grid_01,L'\x15');
        }
      }
      for (y = L'\0'; y < uVar5 + L'\x06'; y = y + L'\x01') {
        build_streamer(c,L'\x17',L'\0');
      }
      generate_starburst_room
                (c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',false,L'\x01',
                 false);
      for (pgrid.y = 1; pgrid.y < c->height + -1; pgrid.y = pgrid.y + 1) {
        for (pgrid.x = 1; pgrid.x < c->width + -1; pgrid.x = pgrid.x + 1) {
          grid_02.y = pgrid.y;
          grid_02.x = pgrid.x;
          psVar8 = square((chunk *)c,grid_02);
          flag_off(psVar8->info,3,4);
        }
      }
      uVar1 = z_info->town_wid;
      uVar6 = Rand_div(z_info->town_wid / 6 + 1 + z_info->town_wid / 6);
      xroads.x = (uVar1 / 2 + uVar6) - z_info->town_wid / 6;
      xroads.y = 1;
      while( true ) {
        grid_00.y = xroads.y;
        grid_00.x = xroads.x;
        _Var4 = square_isfloor((chunk *)c,grid_00);
        bVar2 = false;
        if (!_Var4) {
          bVar2 = xroads.y < (int)(z_info->town_hgt / 4);
        }
        if (!bVar2) break;
        xroads.y = xroads.y + 1;
      }
    } while ((int)(z_info->town_hgt / 4) <= xroads.y);
    for (grid.y = xroads.x + L'\xffffffff'; grid.y <= xroads.x + L'\x01'; grid.y = grid.y + 1) {
      for (grid.x = xroads.y + -1; grid.x <= xroads.y + 1; grid.x = grid.x + 1) {
        lVar10 = (loc_conflict)loc(grid.y,grid.x);
        _Var4 = square_isfiery((chunk *)c,lVar10);
        if (_Var4) {
          lVar10 = (loc_conflict)loc(grid.y,grid.x);
          square_set_feat((chunk *)c,lVar10,L'\x15');
        }
      }
    }
    uVar1 = z_info->town_hgt;
    uVar6 = Rand_div(z_info->town_hgt / 4);
    uVar7 = Rand_div(z_info->town_hgt / 8);
    num_lava = (uVar1 / 2 - uVar6) + uVar7;
    grid.y = -xroads.x / 6;
    B = (int)((uint)z_info->town_wid - xroads.x) / 6;
    B_00 = ((uint)z_info->town_hgt - num_lava) / 4;
    max_store_y = L'\0';
    for (y = L'\0'; y < (int)(uint)z_info->store_max; y = y + L'\x01') {
      local_89 = false;
      while (local_89 == false && max_store_y < L'd') {
        max_store_y = max_store_y + L'\x01';
        uVar6 = Rand_div(2);
        if (uVar6 == 0) {
          uVar6 = Rand_div(2);
          iStack_88 = -1;
          if (uVar6 != 0) {
            iStack_88 = 1;
          }
          iStack_84 = rand_range(-num_lava / 4,B_00);
        }
        else {
          iStack_88 = rand_range(grid.y,B);
          uVar6 = Rand_div(2);
          iStack_84 = -1;
          if (uVar6 != 0) {
            iStack_84 = 1;
          }
        }
        if ((iStack_84 != 0) && (iStack_88 != 0)) {
          xroads_00.y = num_lava;
          xroads_00.x = xroads.x;
          lot.y = iStack_84;
          lot.x = iStack_88;
          local_89 = lot_is_clear(c,xroads_00,lot,L'\x06',L'\x04');
        }
      }
      if (L'c' < max_store_y) break;
      if (max_store_x < num_lava + iStack_84 * 4) {
        local_d8 = num_lava + iStack_84 * 4;
      }
      else {
        local_d8 = max_store_x;
      }
      max_store_x = local_d8;
      if (xroads.x + iStack_88 * 6 < _lot_wid) {
        local_dc = xroads.x + iStack_88 * 6;
      }
      else {
        local_dc = _lot_wid;
      }
      _lot_wid = local_dc;
      if (local_5c < xroads.x + iStack_88 * 6) {
        local_e0 = xroads.x + iStack_88 * 6;
      }
      else {
        local_e0 = local_5c;
      }
      local_5c = local_e0;
      xroads_01.y = num_lava;
      xroads_01.x = xroads.x;
      lot_00.y = iStack_84;
      lot_00.x = iStack_88;
      build_store(c,y,xroads_01,lot_00,L'\x06',L'\x04');
    }
    if (max_store_y < L'd') {
      for (; grid.y <= B; grid.y = grid.y + 1) {
        grid.x = -num_lava / 4;
        if (grid.y != 0) {
          for (; grid.x <= B_00; grid.x = grid.x + 1) {
            if (((grid.x != 0) && (uVar6 = Rand_div(100), (int)uVar6 < 0x51)) &&
               (uVar6 = Rand_div(2), uVar6 == 0)) {
              lVar9 = loc(grid.y,grid.x);
              xroads_02.y = num_lava;
              xroads_02.x = xroads.x;
              _Var4 = lot_has_shop(c,xroads_02,lVar9,L'\x06',L'\x04');
              if (!_Var4) {
                lVar9 = loc(grid.y,grid.x);
                xroads_03.y = num_lava;
                xroads_03.x = xroads.x;
                build_ruin(c,xroads_03,lVar9,L'\x06',L'\x04');
              }
            }
          }
        }
      }
      bVar3 = true;
    }
  } while( true );
}

Assistant:

static void town_gen_layout(struct chunk *c, struct player *p)
{
	int n, x, y;
	struct loc grid, pgrid, xroads;
	int num_lava = 3 + randint0(3);
	int ruins_percent = 80;

	int max_attempts = 100;

	int num_attempts = 0;
	bool success = false;

	int max_store_y = 0;
	int min_store_x = z_info->town_wid;
	int max_store_x = 0;

	/* divide the town into lots */
	uint16_t lot_hgt = 4, lot_wid = 6;

	/* Create walls */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, FEAT_PERM,
		SQUARE_NONE, true);

	while (!success) {
		/* Initialize to ROCK for build_streamer precondition */
		for (grid.y = 1; grid.y < c->height - 1; grid.y++)
			for (grid.x = 1; grid.x < c->width - 1; grid.x++) {
				square_set_feat(c, grid, FEAT_GRANITE);
			}

		/* Make some lava streamers */
		for (n = 0; n < 3 + num_lava; n++)
			build_streamer(c, FEAT_LAVA, 0);

		/* Make a town-sized starburst room. */
		(void) generate_starburst_room(c, 0, 0, c->height - 1,
			c->width - 1, false, FEAT_FLOOR, false);

		/* Turn off room illumination flag */
		for (grid.y = 1; grid.y < c->height - 1; grid.y++) {
			for (grid.x = 1; grid.x < c->width - 1; grid.x++) {
				sqinfo_off(square(c, grid)->info, SQUARE_ROOM);
			}
		}

		/* Stairs along north wall */
		pgrid.x = rand_spread(z_info->town_wid / 2,
			z_info->town_wid / 6);
		pgrid.y = 1;
		while (!square_isfloor(c, pgrid) && (pgrid.y < z_info->town_hgt / 4)) {
			pgrid.y++;
		}
		if (pgrid.y >= z_info->town_hgt / 4) continue;


		/* no lava next to stairs */
		for (x = pgrid.x - 1; x <= pgrid.x + 1; x++) {
			for (y = pgrid.y - 1; y <= pgrid.y + 1; y++) {
				if (square_isfiery(c, loc(x, y))) {
					square_set_feat(c, loc(x, y), FEAT_GRANITE);
				}
			}
		}

		xroads.x = pgrid.x;
		xroads.y = z_info->town_hgt / 2
				- randint0(z_info->town_hgt / 4)
				+ randint0(z_info->town_hgt / 8);


		int lot_min_x = -1 * xroads.x / lot_wid;
		int lot_max_x = (z_info->town_wid - xroads.x) / lot_wid;
		int lot_min_y = -1 * xroads.y / lot_hgt;
		int lot_max_y = (z_info->town_hgt - xroads.y) / lot_hgt;

		/* place stores along the streets */
		num_attempts = 0;
		for (n = 0; n < z_info->store_max; n++) {
			struct loc store_lot;
			bool found_spot = false;
			while (!found_spot && num_attempts < max_attempts) {
				num_attempts++;
				if (randint0(2)) {
					/* east-west street */
					store_lot.x = rand_range(lot_min_x, lot_max_x);
					store_lot.y = randint0(2) ? 1 : -1;
				} else {
					/* north-south street */
					store_lot.x = randint0(2) ? 1 : -1;
					store_lot.y = rand_range(lot_min_y, lot_max_y);
				}
				if (store_lot.y == 0 || store_lot.x == 0) continue;
				found_spot = lot_is_clear(c, xroads, store_lot,
					lot_wid, lot_hgt);
			}
			if (num_attempts >= max_attempts) break;

			max_store_y = MAX(max_store_y, xroads.y + lot_hgt * store_lot.y);
			min_store_x = MIN(min_store_x, xroads.x + lot_wid * store_lot.x);
			max_store_x = MAX(max_store_x, xroads.x + lot_wid * store_lot.x);

			build_store(c, n, xroads, store_lot, lot_wid, lot_hgt);
		}
		if (num_attempts >= max_attempts) continue;

		/* place ruins */
		for (x = lot_min_x; x <= lot_max_x; x++) {
			if (x == 0) continue; /* 0 is the street */
			for (y = lot_min_y; y <= lot_max_y; y++) {
				if (y == 0) continue;
				if (randint0(100) > ruins_percent) continue;
				if (one_in_(2) &&
					!lot_has_shop(c, xroads, loc(x, y), lot_wid, lot_hgt)) {
					build_ruin(c, xroads, loc(x, y), lot_wid, lot_hgt);
				}
			}
		}
		success = true;
	}

	/* clear the street */
	square_set_feat(c, loc(pgrid.x, pgrid.y + 1), FEAT_FLOOR);
	fill_rectangle(c, pgrid.y + 2, pgrid.x - 1,
		max_store_y, pgrid.x + 1, FEAT_FLOOR, SQUARE_NONE);

	fill_rectangle(c, xroads.y, min_store_x,
		xroads.y + 1, max_store_x, FEAT_FLOOR, SQUARE_NONE);

	/* Clear previous contents, add down stairs */
	square_set_feat(c, pgrid, FEAT_MORE);

	/* Place the player */
	player_place(c, p, pgrid);
}